

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Uuid.hpp
# Opt level: O3

string * uuid::gen_uuid_abi_cxx11_(void)

{
  result_type_conflict1 rVar1;
  string *psVar2;
  int iVar3;
  stringstream local_1b8 [8];
  stringstream ss;
  long local_1a8 [3];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
  iVar3 = 8;
  do {
    rVar1 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&dis,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)gen,(param_type *)&dis);
    std::ostream::operator<<((ostream *)local_1a8,rVar1);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"-",1);
  iVar3 = 4;
  do {
    rVar1 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&dis,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)gen,(param_type *)&dis);
    std::ostream::operator<<((ostream *)local_1a8,rVar1);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"-4",2);
  iVar3 = 3;
  do {
    rVar1 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&dis,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)gen,(param_type *)&dis);
    std::ostream::operator<<((ostream *)local_1a8,rVar1);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"-",1);
  rVar1 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&dis2,
                     (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)gen,(param_type *)&dis2);
  std::ostream::operator<<((ostream *)local_1a8,rVar1);
  iVar3 = 3;
  do {
    rVar1 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&dis,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)gen,(param_type *)&dis);
    std::ostream::operator<<((ostream *)local_1a8,rVar1);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"-",1);
  iVar3 = 0xc;
  do {
    rVar1 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&dis,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)gen,(param_type *)&dis);
    std::ostream::operator<<((ostream *)local_1a8,rVar1);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  psVar2 = (string *)std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

static std::string gen_uuid() {
  std::stringstream ss;
  int i;
  ss << std::hex;
  for (i = 0; i < 8; i++) {
    ss << dis(gen);
  }
  ss << "-";
  for (i = 0; i < 4; i++) {
    ss << dis(gen);
  }
  ss << "-4";
  for (i = 0; i < 3; i++) {
    ss << dis(gen);
  }
  ss << "-";
  ss << dis2(gen);
  for (i = 0; i < 3; i++) {
    ss << dis(gen);
  }
  ss << "-";
  for (i = 0; i < 12; i++) {
    ss << dis(gen);
  }
  return ss.str();
}